

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall cmCTest::Initialize(cmCTest *this,char *binary_dir,cmCTestStartCommand *command)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  void *pvVar4;
  char *pcVar5;
  cmMakefile *pcVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined8 in_stack_ffffffffffffd598;
  long lVar9;
  undefined4 uVar10;
  byte local_28e9;
  string local_2840 [32];
  string local_2820;
  undefined1 local_2800 [8];
  ostringstream cmCTestLog_msg_14;
  string local_2688 [32];
  undefined1 local_2668 [8];
  ostringstream cmCTestLog_msg_13;
  string local_24f0 [32];
  string local_24d0;
  undefined1 local_24b0 [8];
  ostringstream cmCTestLog_msg_12;
  string local_2338;
  undefined1 local_2318 [8];
  ofstream ofs;
  char datestring [100];
  allocator local_20a9;
  string local_20a8;
  string local_2088;
  string local_2068 [32];
  undefined1 local_2048 [8];
  ostringstream cmCTestLog_msg_11;
  string local_1ed0 [32];
  string local_1eb0;
  undefined1 local_1e90 [8];
  ostringstream cmCTestLog_msg_10;
  undefined1 local_1d18 [8];
  string tagmode;
  undefined4 local_1cf0;
  int min;
  int hour;
  int day;
  int mon;
  int year;
  tm *lctime;
  time_t tctime;
  string tag;
  ifstream tfin;
  undefined1 local_1aa8 [8];
  string tagfile;
  string local_1a80 [7];
  bool createNewTag;
  undefined1 local_1a60 [8];
  ostringstream cmCTestLog_msg_9;
  string local_18e8 [32];
  undefined1 local_18c8 [8];
  ostringstream cmCTestLog_msg_8;
  undefined1 local_1750 [8];
  string testingDir;
  string local_1728 [32];
  undefined1 local_1708 [8];
  ostringstream cmCTestLog_msg_7;
  cmStateSnapshot local_1590;
  auto_ptr<cmMakefile> local_1578;
  auto_ptr<cmMakefile> mf;
  cmGlobalGenerator gg;
  allocator local_f89;
  string local_f88;
  allocator local_f61;
  string local_f60;
  undefined1 local_f40 [8];
  cmake cm;
  ostringstream local_c68 [8];
  ostringstream cmCTestLog_msg_6;
  string local_af0 [32];
  ostringstream local_ad0 [8];
  ostringstream cmCTestLog_msg_5;
  allocator local_951;
  string local_950;
  string local_930;
  string local_910 [32];
  ostringstream local_8f0 [8];
  ostringstream cmCTestLog_msg_4;
  string local_778 [39];
  allocator local_751;
  string local_750;
  string local_730;
  string local_710;
  allocator local_6e9;
  string local_6e8;
  string local_6c8;
  ostringstream local_6a8 [8];
  ostringstream cmCTestLog_msg_3;
  string local_530 [32];
  ostringstream local_510 [8];
  ostringstream cmCTestLog_msg_2;
  string local_398 [32];
  ostringstream local_378 [8];
  ostringstream cmCTestLog_msg_1;
  allocator local_1f9;
  string local_1f8;
  string local_1d8 [48];
  ostringstream local_1a8 [8];
  ostringstream cmCTestLog_msg;
  bool local_29;
  bool quiet;
  cmCTestStartCommand *command_local;
  char *binary_dir_local;
  cmCTest *this_local;
  
  uVar10 = (undefined4)((ulong)in_stack_ffffffffffffd598 >> 0x20);
  local_29 = false;
  if ((command != (cmCTestStartCommand *)0x0) &&
     (bVar1 = cmCTestStartCommand::ShouldBeQuiet(command), bVar1)) {
    local_29 = true;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar3 = std::operator<<((ostream *)local_1a8,"Here: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,0x181);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  Log(this,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x181,pcVar5,local_29);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  if ((this->InteractiveDebugMode & 1U) == 0) {
    BlockTestErrorDiagnostics(this);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f8,"CTEST_INTERACTIVE_DEBUG_MODE=1",&local_1f9);
    cmsys::SystemTools::PutEnv(&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  }
  std::__cxx11::string::operator=((string *)&this->BinaryDir,binary_dir);
  cmsys::SystemTools::ConvertToUnixSlashes(&this->BinaryDir);
  UpdateCTestConfiguration(this);
  std::__cxx11::ostringstream::ostringstream(local_378);
  poVar3 = std::operator<<((ostream *)local_378,"Here: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,0x18d);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  Log(this,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x18d,pcVar5,local_29);
  std::__cxx11::string::~string(local_398);
  std::__cxx11::ostringstream::~ostringstream(local_378);
  if ((this->ProduceXML & 1U) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_510);
    poVar3 = std::operator<<((ostream *)local_510,"Here: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,399);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        399,pcVar5,local_29);
    std::__cxx11::string::~string(local_530);
    std::__cxx11::ostringstream::~ostringstream(local_510);
    std::__cxx11::ostringstream::ostringstream(local_6a8);
    poVar3 = std::operator<<((ostream *)local_6a8,"   Site: ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6e8,"Site",&local_6e9);
    GetCTestConfiguration(&local_6c8,this,&local_6e8);
    poVar3 = std::operator<<(poVar3,(string *)&local_6c8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"   Build name: ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_750,"BuildName",&local_751);
    GetCTestConfiguration(&local_730,this,&local_750);
    SafeBuildIdField(&local_710,&local_730);
    poVar3 = std::operator<<(poVar3,(string *)&local_710);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_710);
    std::__cxx11::string::~string((string *)&local_730);
    std::__cxx11::string::~string((string *)&local_750);
    std::allocator<char>::~allocator((allocator<char> *)&local_751);
    std::__cxx11::string::~string((string *)&local_6c8);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    Log(this,1,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x196,pcVar5,local_29);
    std::__cxx11::string::~string(local_778);
    std::__cxx11::ostringstream::~ostringstream(local_6a8);
    std::__cxx11::ostringstream::ostringstream(local_8f0);
    poVar3 = std::operator<<((ostream *)local_8f0,"Produce XML is on");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x197,pcVar5,local_29);
    std::__cxx11::string::~string(local_910);
    std::__cxx11::ostringstream::~ostringstream(local_8f0);
    local_28e9 = 0;
    if (this->TestModel == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_950,"NightlyStartTime",&local_951);
      GetCTestConfiguration(&local_930,this,&local_950);
      local_28e9 = std::__cxx11::string::empty();
      std::__cxx11::string::~string((string *)&local_930);
      std::__cxx11::string::~string((string *)&local_950);
      std::allocator<char>::~allocator((allocator<char> *)&local_951);
    }
    if ((local_28e9 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_ad0);
      poVar3 = std::operator<<((ostream *)local_ad0,
                               "WARNING: No nightly start time found please set in CTestConfig.cmake or DartConfig.cmake"
                              );
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x19f,pcVar5,local_29);
      std::__cxx11::string::~string(local_af0);
      std::__cxx11::ostringstream::~ostringstream(local_ad0);
      std::__cxx11::ostringstream::ostringstream(local_c68);
      poVar3 = std::operator<<((ostream *)local_c68,"Here: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,0x1a0);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      Log(this,0,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x1a1,pcVar5,local_29);
      std::__cxx11::string::~string((string *)&cm.Debugger);
      std::__cxx11::ostringstream::~ostringstream(local_c68);
      return 0;
    }
  }
  cmake::cmake((cmake *)local_f40,RoleScript);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f60,"",&local_f61);
  cmake::SetHomeDirectory((cmake *)local_f40,&local_f60);
  std::__cxx11::string::~string((string *)&local_f60);
  std::allocator<char>::~allocator((allocator<char> *)&local_f61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f88,"",&local_f89);
  cmake::SetHomeOutputDirectory((cmake *)local_f40,&local_f88);
  std::__cxx11::string::~string((string *)&local_f88);
  std::allocator<char>::~allocator((allocator<char> *)&local_f89);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)&gg.InstallTargetEnabled,(cmake *)local_f40);
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&gg.InstallTargetEnabled);
  cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)&mf,(cmake *)local_f40);
  pcVar6 = (cmMakefile *)operator_new(0x760);
  cmake::GetCurrentSnapshot(&local_1590,(cmake *)local_f40);
  cmMakefile::cmMakefile(pcVar6,(cmGlobalGenerator *)&mf,&local_1590);
  ::cm::auto_ptr<cmMakefile>::auto_ptr(&local_1578,pcVar6);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  pcVar6 = ::cm::auto_ptr<cmMakefile>::get(&local_1578);
  iVar2 = ReadCustomConfigurationFileTree(this,pcVar5,pcVar6);
  if (iVar2 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1708);
    poVar3 = std::operator<<((ostream *)local_1708,"Cannot find custom configuration file tree");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x1b0,pcVar5,local_29);
    std::__cxx11::string::~string(local_1728);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1708);
    this_local._4_4_ = 0;
    testingDir.field_2._12_4_ = 1;
    goto LAB_0053234c;
  }
  if ((this->ProduceXML & 1U) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1750,
                   &this->BinaryDir,"/Testing");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(pcVar5);
    if (bVar1) {
      bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_1750);
      if (bVar1) goto LAB_005315ad;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18c8);
      poVar3 = std::operator<<((ostream *)local_18c8,"File ");
      poVar3 = std::operator<<(poVar3,(string *)local_1750);
      poVar3 = std::operator<<(poVar3," is in the place of the testing directory");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      Log(this,6,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x1bd,pcVar5,false);
      std::__cxx11::string::~string(local_18e8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_18c8);
      this_local._4_4_ = 0;
      testingDir.field_2._12_4_ = 1;
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmsys::SystemTools::MakeDirectory(pcVar5);
      if (bVar1) {
LAB_005315ad:
        tagfile.field_2._M_local_buf[0xf] = '\x01';
        if (command != (cmCTestStartCommand *)0x0) {
          tagfile.field_2._M_local_buf[0xf] = cmCTestStartCommand::ShouldCreateNewTag(command);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1aa8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1750,"/TAG");
        pcVar5 = (char *)std::__cxx11::string::c_str();
        std::ifstream::ifstream((void *)((long)&tag.field_2 + 8),pcVar5,_S_in);
        std::__cxx11::string::string((string *)&tctime);
        if ((tagfile.field_2._M_local_buf[0xf] & 1U) == 0) {
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)((long)&tag.field_2 + *(long *)(tag.field_2._8_8_ + -0x18) + 8))
          ;
          if (bVar1) {
            cmsys::SystemTools::GetLineFromStream
                      ((istream *)(tag.field_2._M_local_buf + 8),(string *)&tctime,(bool *)0x0,-1);
            std::ifstream::close();
          }
          uVar8 = std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2800);
            poVar3 = std::operator<<((ostream *)local_2800,"  Use existing tag: ");
            poVar3 = std::operator<<(poVar3,(string *)&tctime);
            poVar3 = std::operator<<(poVar3," - ");
            GetTestModelString_abi_cxx11_(&local_2820,this);
            poVar3 = std::operator<<(poVar3,(string *)&local_2820);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_2820);
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            Log(this,1,
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
                ,0x219,pcVar5,local_29);
            std::__cxx11::string::~string(local_2840);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2800);
            goto LAB_005322a5;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2668);
          poVar3 = std::operator<<((ostream *)local_2668,"Cannot read existing TAG file in ");
          poVar3 = std::operator<<(poVar3,(string *)local_1750);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          Log(this,6,
              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
              ,0x212,pcVar5,false);
          std::__cxx11::string::~string(local_2688);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2668);
          this_local._4_4_ = 0;
          testingDir.field_2._12_4_ = 1;
        }
        else {
          lctime = (tm *)time((time_t *)0x0);
          if ((this->TomorrowTag & 1U) != 0) {
            lctime = (tm *)&lctime[0x606].tm_zone;
          }
          _mon = (tm *)gmtime((time_t *)&lctime);
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)((long)&tag.field_2 + *(long *)(tag.field_2._8_8_ + -0x18) + 8))
          ;
          if ((bVar1) &&
             (bVar1 = cmsys::SystemTools::GetLineFromStream
                                ((istream *)(tag.field_2._M_local_buf + 8),(string *)&tctime,
                                 (bool *)0x0,-1), bVar1)) {
            day = 0;
            hour = 0;
            min = 0;
            local_1cf0 = 0;
            tagmode.field_2._12_4_ = 0;
            uVar7 = std::__cxx11::string::c_str();
            lVar9 = (long)&tagmode.field_2._M_allocated_capacity + 0xc;
            __isoc99_sscanf(uVar7,"%04d%02d%02d-%02d%02d",&day,&hour,&min,&local_1cf0,lVar9);
            uVar10 = (undefined4)((ulong)lVar9 >> 0x20);
            if ((day != ((tm *)_mon)->tm_year + 0x76c) ||
               ((hour != ((tm *)_mon)->tm_mon + 1 || (min != ((tm *)_mon)->tm_mday)))) {
              std::__cxx11::string::operator=((string *)&tctime,"");
            }
            std::__cxx11::string::string((string *)local_1d18);
            bVar1 = cmsys::SystemTools::GetLineFromStream
                              ((istream *)(tag.field_2._M_local_buf + 8),(string *)local_1d18,
                               (bool *)0x0,-1);
            if (((bVar1) && (uVar8 = std::__cxx11::string::size(), 4 < uVar8)) &&
               (bVar1 = PartInfo::operator_cast_to_bool(this->Parts), !bVar1)) {
              pcVar5 = (char *)std::__cxx11::string::c_str();
              iVar2 = GetTestModelFromString(pcVar5);
              this->TestModel = iVar2;
            }
            std::ifstream::close();
            std::__cxx11::string::~string((string *)local_1d18);
          }
          uVar8 = std::__cxx11::string::empty();
          if ((((uVar8 & 1) != 0) || (command != (cmCTestStartCommand *)0x0)) ||
             (bVar1 = PartInfo::operator_cast_to_bool(this->Parts), bVar1)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e90);
            poVar3 = std::operator<<((ostream *)local_1e90,"TestModel: ");
            GetTestModelString_abi_cxx11_(&local_1eb0,this);
            poVar3 = std::operator<<(poVar3,(string *)&local_1eb0);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_1eb0);
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            Log(this,0,
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
                ,0x1f0,pcVar5,local_29);
            std::__cxx11::string::~string(local_1ed0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e90);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2048);
            poVar3 = std::operator<<((ostream *)local_2048,"TestModel: ");
            pvVar4 = (void *)std::ostream::operator<<(poVar3,this->TestModel);
            std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            Log(this,0,
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
                ,0x1f2,pcVar5,local_29);
            std::__cxx11::string::~string(local_2068);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2048);
            if (this->TestModel == 1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_20a8,"NightlyStartTime",&local_20a9);
              GetCTestConfiguration(&local_2088,this,&local_20a8);
              _mon = GetNightlyTime(this,&local_2088,(bool)(this->TomorrowTag & 1));
              std::__cxx11::string::~string((string *)&local_2088);
              std::__cxx11::string::~string((string *)&local_20a8);
              std::allocator<char>::~allocator((allocator<char> *)&local_20a9);
            }
            sprintf(&ofs.field_0x1f8,"%04d%02d%02d-%02d%02d",(ulong)(((tm *)_mon)->tm_year + 0x76c),
                    (ulong)(((tm *)_mon)->tm_mon + 1),(ulong)(uint)((tm *)_mon)->tm_mday,
                    (ulong)(uint)((tm *)_mon)->tm_hour,CONCAT44(uVar10,((tm *)_mon)->tm_min));
            std::__cxx11::string::operator=((string *)&tctime,&ofs.field_0x1f8);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            std::ofstream::ofstream(local_2318,pcVar5,_S_out);
            bVar1 = std::ios::operator_cast_to_bool
                              ((ios *)(local_2318 + (long)*(_func_int **)((long)local_2318 + -0x18))
                              );
            if (bVar1) {
              poVar3 = std::operator<<((ostream *)local_2318,(string *)&tctime);
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              GetTestModelString_abi_cxx11_(&local_2338,this);
              poVar3 = std::operator<<((ostream *)local_2318,(string *)&local_2338);
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string((string *)&local_2338);
            }
            std::ofstream::close();
            if (command == (cmCTestStartCommand *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_24b0);
              poVar3 = std::operator<<((ostream *)local_24b0,"Create new tag: ");
              poVar3 = std::operator<<(poVar3,(string *)&tctime);
              poVar3 = std::operator<<(poVar3," - ");
              GetTestModelString_abi_cxx11_(&local_24d0,this);
              poVar3 = std::operator<<(poVar3,(string *)&local_24d0);
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string((string *)&local_24d0);
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              Log(this,1,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
                  ,0x207,pcVar5,local_29);
              std::__cxx11::string::~string(local_24f0);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_24b0);
            }
            std::ofstream::~ofstream(local_2318);
          }
LAB_005322a5:
          std::__cxx11::string::operator=((string *)&this->CurrentTag,(string *)&tctime);
          testingDir.field_2._12_4_ = 0;
        }
        std::__cxx11::string::~string((string *)&tctime);
        std::ifstream::~ifstream((void *)((long)&tag.field_2 + 8));
        std::__cxx11::string::~string((string *)local_1aa8);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a60);
        poVar3 = std::operator<<((ostream *)local_1a60,"Cannot create directory ");
        poVar3 = std::operator<<(poVar3,(string *)local_1750);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        Log(this,6,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x1c3,pcVar5,false);
        std::__cxx11::string::~string(local_1a80);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a60);
        this_local._4_4_ = 0;
        testingDir.field_2._12_4_ = 1;
      }
    }
    std::__cxx11::string::~string((string *)local_1750);
    if (testingDir.field_2._12_4_ != 0) goto LAB_0053234c;
  }
  this_local._4_4_ = 1;
  testingDir.field_2._12_4_ = 1;
LAB_0053234c:
  ::cm::auto_ptr<cmMakefile>::~auto_ptr(&local_1578);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&mf);
  cmake::~cmake((cmake *)local_f40);
  return this_local._4_4_;
}

Assistant:

int cmCTest::Initialize(const char* binary_dir, cmCTestStartCommand* command)
{
  bool quiet = false;
  if (command && command->ShouldBeQuiet()) {
    quiet = true;
  }

  cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
  if (!this->InteractiveDebugMode) {
    this->BlockTestErrorDiagnostics();
  } else {
    cmSystemTools::PutEnv("CTEST_INTERACTIVE_DEBUG_MODE=1");
  }

  this->BinaryDir = binary_dir;
  cmSystemTools::ConvertToUnixSlashes(this->BinaryDir);

  this->UpdateCTestConfiguration();

  cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
  if (this->ProduceXML) {
    cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
    cmCTestOptionalLog(
      this, OUTPUT, "   Site: "
        << this->GetCTestConfiguration("Site") << std::endl
        << "   Build name: "
        << cmCTest::SafeBuildIdField(this->GetCTestConfiguration("BuildName"))
        << std::endl,
      quiet);
    cmCTestOptionalLog(this, DEBUG, "Produce XML is on" << std::endl, quiet);
    if (this->TestModel == cmCTest::NIGHTLY &&
        this->GetCTestConfiguration("NightlyStartTime").empty()) {
      cmCTestOptionalLog(
        this, WARNING,
        "WARNING: No nightly start time found please set in CTestConfig.cmake"
        " or DartConfig.cmake"
          << std::endl,
        quiet);
      cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl,
                         quiet);
      return 0;
    }
  }

  cmake cm(cmake::RoleScript);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  CM_AUTO_PTR<cmMakefile> mf(new cmMakefile(&gg, cm.GetCurrentSnapshot()));
  if (!this->ReadCustomConfigurationFileTree(this->BinaryDir.c_str(),
                                             mf.get())) {
    cmCTestOptionalLog(
      this, DEBUG, "Cannot find custom configuration file tree" << std::endl,
      quiet);
    return 0;
  }

  if (this->ProduceXML) {
    // Verify "Testing" directory exists:
    //
    std::string testingDir = this->BinaryDir + "/Testing";
    if (cmSystemTools::FileExists(testingDir.c_str())) {
      if (!cmSystemTools::FileIsDirectory(testingDir)) {
        cmCTestLog(this, ERROR_MESSAGE, "File "
                     << testingDir
                     << " is in the place of the testing directory"
                     << std::endl);
        return 0;
      }
    } else {
      if (!cmSystemTools::MakeDirectory(testingDir.c_str())) {
        cmCTestLog(this, ERROR_MESSAGE, "Cannot create directory "
                     << testingDir << std::endl);
        return 0;
      }
    }

    // Create new "TAG" file or read existing one:
    //
    bool createNewTag = true;
    if (command) {
      createNewTag = command->ShouldCreateNewTag();
    }

    std::string tagfile = testingDir + "/TAG";
    cmsys::ifstream tfin(tagfile.c_str());
    std::string tag;

    if (createNewTag) {
      time_t tctime = time(CM_NULLPTR);
      if (this->TomorrowTag) {
        tctime += (24 * 60 * 60);
      }
      struct tm* lctime = gmtime(&tctime);
      if (tfin && cmSystemTools::GetLineFromStream(tfin, tag)) {
        int year = 0;
        int mon = 0;
        int day = 0;
        int hour = 0;
        int min = 0;
        sscanf(tag.c_str(), "%04d%02d%02d-%02d%02d", &year, &mon, &day, &hour,
               &min);
        if (year != lctime->tm_year + 1900 || mon != lctime->tm_mon + 1 ||
            day != lctime->tm_mday) {
          tag = "";
        }
        std::string tagmode;
        if (cmSystemTools::GetLineFromStream(tfin, tagmode)) {
          if (tagmode.size() > 4 && !this->Parts[PartStart]) {
            this->TestModel = cmCTest::GetTestModelFromString(tagmode.c_str());
          }
        }
        tfin.close();
      }
      if (tag.empty() || (CM_NULLPTR != command) || this->Parts[PartStart]) {
        cmCTestOptionalLog(
          this, DEBUG,
          "TestModel: " << this->GetTestModelString() << std::endl, quiet);
        cmCTestOptionalLog(
          this, DEBUG, "TestModel: " << this->TestModel << std::endl, quiet);
        if (this->TestModel == cmCTest::NIGHTLY) {
          lctime = this->GetNightlyTime(
            this->GetCTestConfiguration("NightlyStartTime"),
            this->TomorrowTag);
        }
        char datestring[100];
        sprintf(datestring, "%04d%02d%02d-%02d%02d", lctime->tm_year + 1900,
                lctime->tm_mon + 1, lctime->tm_mday, lctime->tm_hour,
                lctime->tm_min);
        tag = datestring;
        cmsys::ofstream ofs(tagfile.c_str());
        if (ofs) {
          ofs << tag << std::endl;
          ofs << this->GetTestModelString() << std::endl;
        }
        ofs.close();
        if (CM_NULLPTR == command) {
          cmCTestOptionalLog(this, OUTPUT, "Create new tag: "
                               << tag << " - " << this->GetTestModelString()
                               << std::endl,
                             quiet);
        }
      }
    } else {
      if (tfin) {
        cmSystemTools::GetLineFromStream(tfin, tag);
        tfin.close();
      }

      if (tag.empty()) {
        cmCTestLog(this, ERROR_MESSAGE, "Cannot read existing TAG file in "
                     << testingDir << std::endl);
        return 0;
      }

      cmCTestOptionalLog(this, OUTPUT, "  Use existing tag: "
                           << tag << " - " << this->GetTestModelString()
                           << std::endl,
                         quiet);
    }

    this->CurrentTag = tag;
  }

  return 1;
}